

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

void mjs::anon_unknown_35::anon_unknown_15::throw_uri_error(gc_heap_ptr<mjs::global_object> *global)

{
  native_error_exception *this;
  global_object *this_00;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_60 [2];
  wstring local_40;
  wstring_view local_20;
  gc_heap_ptr<mjs::global_object> *local_10;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  local_10 = global;
  this = (native_error_exception *)__cxa_allocate_exception(0x58);
  this_00 = gc_heap_ptr<mjs::global_object>::operator->(local_10);
  global_object::stack_trace_abi_cxx11_(&local_40,this_00);
  local_20 = (wstring_view)
             std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_40);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (local_60,L"URI malformed");
  native_error_exception::native_error_exception(this,uri,&local_20,local_60);
  __cxa_throw(this,&native_error_exception::typeinfo,native_error_exception::~native_error_exception
             );
}

Assistant:

[[noreturn]] void throw_uri_error(const gc_heap_ptr<global_object>& global) {
    throw native_error_exception{native_error_type::uri, global->stack_trace(), L"URI malformed"};
}